

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O2

Gia_Man_t * Gia_ManReadGig(char *pFileName)

{
  abctime aVar1;
  FILE *__stream;
  Vec_Str_t *vLines;
  abctime aVar2;
  Gls_Man_t *p;
  Gia_Man_t *pGVar3;
  int level;
  char *pcVar4;
  long lVar5;
  int pCounts [11];
  int local_68 [14];
  
  aVar1 = Abc_Clock();
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot read file \"%s\".\n",pFileName);
    pGVar3 = (Gia_Man_t *)0x0;
  }
  else {
    vLines = Gls_ManCount((FILE *)__stream,local_68);
    pcVar4 = (char *)__stream;
    rewind(__stream);
    for (lVar5 = 0; level = (int)pcVar4, lVar5 != 0x2c; lVar5 = lVar5 + 4) {
      if (*(int *)((long)local_68 + lVar5) != 0) {
        pcVar4 = "%s=%d  ";
        printf("%s=%d  ",(long)&s_Strs_rel + (long)*(int *)((long)&s_Strs_rel + lVar5));
      }
    }
    aVar2 = Abc_Clock();
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
    p = Gls_ManAlloc(vLines,local_68);
    Gls_ManParse((FILE *)__stream,p);
    pGVar3 = Gls_ManConstruct(p,pFileName);
    Gls_ManStop(p);
    fclose(__stream);
  }
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManReadGig( char * pFileName )
{
    abctime clk = Abc_Clock();
    Gls_Man_t * p = NULL;
    Gia_Man_t * pGia = NULL;
    Vec_Str_t * vLines;
    int i, pCounts[GLS_FINAL];
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot read file \"%s\".\n", pFileName );
        return NULL;
    }
    vLines = Gls_ManCount( pFile, pCounts );
    rewind( pFile );
    // statistics
    for ( i = 0; i < GLS_FINAL; i++ )
        if ( pCounts[i] )
            printf( "%s=%d  ", s_Strs[i], pCounts[i] );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // collect data and derive AIG
    p = Gls_ManAlloc( vLines, pCounts );
    if ( Gls_ManParse( pFile, p ) )
        pGia = Gls_ManConstruct( p, pFileName );
    Gls_ManStop( p );
    fclose( pFile );
    //printf( "\n" );
    return pGia;
}